

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  undefined1 local_58 [8];
  StrAccum acc;
  __va_list_tag *ap_local;
  char *zFormat_local;
  char *zBuf_local;
  char *pcStack_10;
  int n_local;
  
  pcStack_10 = zBuf;
  if (0 < n) {
    acc._32_8_ = ap;
    sqlite3StrAccumInit((StrAccum *)local_58,zBuf,n,0);
    acc.nAlloc._1_1_ = 0;
    sqlite3VXPrintf((StrAccum *)local_58,0,zFormat,(__va_list_tag *)acc._32_8_);
    pcStack_10 = sqlite3StrAccumFinish((StrAccum *)local_58);
  }
  return pcStack_10;
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
  sqlite3StrAccumInit(&acc, zBuf, n, 0);
  acc.useMalloc = 0;
  sqlite3VXPrintf(&acc, 0, zFormat, ap);
  return sqlite3StrAccumFinish(&acc);
}